

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_nws_image.cc
# Opt level: O2

void __thiscall NWSImageHandler::handle(NWSImageHandler *this,shared_ptr<const_lrit::File> *f)

{
  FileWriter *pFVar1;
  bool bVar2;
  char *pcVar3;
  string *extension;
  void *__buf;
  NWSImageHandler *this_00;
  NOAALRITHeader NVar4;
  TimeStampHeader TVar5;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  string path;
  tm tm;
  PrimaryHeader ph;
  undefined1 local_370 [8];
  undefined1 local_368 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  undefined1 local_338 [32];
  _Rb_tree_impl<std::less<int>,_true> local_318;
  string local_2d8;
  string local_2b8;
  PrimaryHeader local_298;
  undefined1 local_280 [32];
  _Alloc_hider local_260;
  timespec local_240;
  
  lrit::File::getHeader<lrit::PrimaryHeader>
            (&local_298,(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            );
  if (local_298.fileType == '\0') {
    NVar4 = lrit::File::getHeader<lrit::NOAALRITHeader>
                      ((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if (NVar4.productID == 6) {
      FilenameBuilder::FilenameBuilder((FilenameBuilder *)local_280);
      this_00 = (NWSImageHandler *)&(this->config_).dir;
      std::__cxx11::string::_M_assign((string *)local_280);
      getBasename_abi_cxx11_
                ((string *)local_338,this_00,
                 (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      std::__cxx11::string::operator=((string *)&local_260,(string *)local_338);
      std::__cxx11::string::~string((string *)local_338);
      bVar2 = lrit::hasHeader<lrit::TimeStampHeader>
                        (&((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_);
      if (bVar2) {
        TVar5 = lrit::File::getHeader<lrit::TimeStampHeader>
                          ((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
        local_338._0_8_ = TVar5._0_8_;
        local_338._8_4_ = TVar5._8_4_;
        local_240 = lrit::TimeStampHeader::getUnix((TimeStampHeader *)local_338);
      }
      else {
        local_318._0_8_ = 0;
        local_318.super__Rb_tree_header._M_header._0_8_ = 0;
        local_338._16_8_ = 0;
        local_338._24_8_ = 0;
        local_338._0_8_ = (pointer)0x0;
        local_338._8_4_ = 0;
        local_338._12_4_ = 0;
        local_318.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        pcVar3 = strptime(local_260._M_p,"%Y%m%d%H%M%S",(tm *)local_338);
        if ((pcVar3 == local_260._M_p + 0xe) && (*pcVar3 == '-')) {
          local_240.tv_sec = mktime((tm *)local_338);
          local_240.tv_nsec = 0;
          std::__cxx11::string::string((string *)local_368,pcVar3 + 1,(allocator *)local_370);
        }
        else {
          std::__cxx11::string::string((string *)local_368,(string *)&local_260);
        }
        std::__cxx11::string::operator=((string *)&local_260,(string *)local_368);
        std::__cxx11::string::~string((string *)local_368);
      }
      if ((NVar4._8_8_ & 0xff000000000000) == 0x5000000000000) {
        std::__cxx11::string::string((string *)&local_2b8,"gif",(allocator *)local_368);
        extension = &local_2b8;
        FilenameBuilder::build
                  ((string *)local_338,(FilenameBuilder *)local_280,&(this->config_).filename,
                   extension);
        std::__cxx11::string::~string((string *)&local_2b8);
        pFVar1 = (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        lrit::File::read((File *)local_368,
                         (int)(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr,__buf,(size_t)extension);
        FileWriter::write(pFVar1,(int)local_338,local_368,0);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)local_368);
        if ((this->config_).json == true) {
          FileWriter::writeHeader
                    ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr,(string *)local_338);
        }
        std::__cxx11::string::~string((string *)local_338);
      }
      else {
        std::__shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2> *)(local_368 + 0x20),
                   &f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>);
        Image::createFromFile((Image *)local_370,(shared_ptr<const_lrit::File> *)(local_368 + 0x20))
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_340);
        std::__cxx11::string::string((string *)&local_2d8,(string *)&(this->config_).format);
        FilenameBuilder::build
                  ((string *)local_368,(FilenameBuilder *)local_280,&(this->config_).filename,
                   &local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        pFVar1 = (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        Image::getRawImage((Image *)local_338);
        FileWriter::write(pFVar1,(int)local_368,local_338,0);
        cv::Mat::~Mat((Mat *)local_338);
        if ((this->config_).json == true) {
          FileWriter::writeHeader
                    ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr,(string *)local_368);
        }
        std::__cxx11::string::~string((string *)local_368);
        std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)local_370);
      }
      FilenameBuilder::~FilenameBuilder((FilenameBuilder *)local_280);
    }
  }
  return;
}

Assistant:

void NWSImageHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 0) {
    return;
  }

  // Filter NWS
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != 6) {
    return;
  }

  FilenameBuilder fb;
  fb.dir = config_.dir;
  fb.filename = getBasename(*f);

  // In the GOES-15 LRIT stream these text files have a time stamp
  // header; in the GOES-R HRIT stream they don't.
  if (f->hasHeader<lrit::TimeStampHeader>()) {
    fb.time = f->getHeader<lrit::TimeStampHeader>().getUnix();
  } else {
    // If time can successfully be extracted from the filename
    // then remove it from the filename passed to the builder.
    fb.filename = parseTime(fb.filename, fb.time);
  }

  // If this is a GIF we can write it directly
  if (nlh.noaaSpecificCompression == 5) {
    auto path = fb.build(config_.filename, "gif");
    fileWriter_->write(path, f->read());
    if (config_.json) {
      fileWriter_->writeHeader(*f, path);
    }
    return;
  }

  auto image = Image::createFromFile(f);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, image->getRawImage());
  if (config_.json) {
    fileWriter_->writeHeader(*f, path);
  }
  return;
}